

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall cmFindCommon::SelectDefaultMacMode(cmFindCommon *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  string fab;
  string ff;
  allocator local_72;
  allocator local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&local_70,"CMAKE_FIND_FRAMEWORK",(allocator *)&local_30);
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_70);
  std::__cxx11::string::string((string *)&local_50,pcVar3,&local_72);
  std::__cxx11::string::~string((string *)&local_70);
  bVar2 = std::operator==(&local_50,"NEVER");
  if (bVar2) {
    bVar2 = false;
LAB_003fa85a:
    bVar4 = false;
LAB_003fa85c:
    bVar5 = false;
LAB_003fa87f:
    this->SearchFrameworkLast = bVar2;
    this->SearchFrameworkFirst = bVar4;
    this->SearchFrameworkOnly = bVar5;
  }
  else {
    bVar2 = std::operator==(&local_50,"ONLY");
    if (bVar2) {
      bVar5 = true;
      bVar2 = false;
      bVar4 = false;
      goto LAB_003fa87f;
    }
    bVar2 = std::operator==(&local_50,"FIRST");
    if (bVar2) {
      bVar4 = true;
      bVar2 = false;
      goto LAB_003fa85c;
    }
    bVar2 = std::operator==(&local_50,"LAST");
    if (bVar2) {
      bVar2 = true;
      goto LAB_003fa85a;
    }
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&local_30,"CMAKE_FIND_APPBUNDLE",&local_72);
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_30);
  std::__cxx11::string::string((string *)&local_70,pcVar3,&local_71);
  std::__cxx11::string::~string((string *)&local_30);
  bVar2 = std::operator==(&local_70,"NEVER");
  if (bVar2) {
    bVar2 = false;
LAB_003fa8eb:
    bVar4 = false;
LAB_003fa8ed:
    bVar5 = false;
  }
  else {
    bVar2 = std::operator==(&local_70,"ONLY");
    if (!bVar2) {
      bVar2 = std::operator==(&local_70,"FIRST");
      if (!bVar2) {
        bVar2 = std::operator==(&local_70,"LAST");
        if (!bVar2) goto LAB_003fa91e;
        bVar2 = true;
        goto LAB_003fa8eb;
      }
      bVar4 = true;
      bVar2 = false;
      goto LAB_003fa8ed;
    }
    bVar5 = true;
    bVar2 = false;
    bVar4 = false;
  }
  this->SearchAppBundleLast = bVar2;
  this->SearchAppBundleFirst = bVar4;
  this->SearchAppBundleOnly = bVar5;
LAB_003fa91e:
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultMacMode()
{
  std::string ff = this->Makefile->GetSafeDefinition("CMAKE_FIND_FRAMEWORK");
  if (ff == "NEVER") {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = false;
  } else if (ff == "ONLY") {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = true;
  } else if (ff == "FIRST") {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = true;
    this->SearchFrameworkOnly = false;
  } else if (ff == "LAST") {
    this->SearchFrameworkLast = true;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = false;
  }

  std::string fab = this->Makefile->GetSafeDefinition("CMAKE_FIND_APPBUNDLE");
  if (fab == "NEVER") {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = false;
  } else if (fab == "ONLY") {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = true;
  } else if (fab == "FIRST") {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = true;
    this->SearchAppBundleOnly = false;
  } else if (fab == "LAST") {
    this->SearchAppBundleLast = true;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = false;
  }
}